

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

int __thiscall
axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::cmpIgnoreCase_pcu
          (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this,StringRef *string)

{
  C CVar1;
  C CVar2;
  ulong uVar3;
  C *pCVar4;
  int unaff_EBP;
  uint uVar5;
  C *pCVar6;
  C *pCVar7;
  
  pCVar6 = this->m_p;
  uVar3 = string->m_length;
  if (this->m_length < string->m_length) {
    uVar3 = this->m_length;
  }
  pCVar7 = string->m_p;
  pCVar4 = pCVar6 + uVar3;
  while( true ) {
    if (pCVar4 <= pCVar6) {
      uVar5 = (uint)(string->m_length < this->m_length);
      if (this->m_length < string->m_length) {
        uVar5 = 0xffffffff;
      }
      return uVar5;
    }
    CVar1 = StringDetailsBase<char>::toLower(*pCVar6);
    CVar2 = StringDetailsBase<char>::toLower(*pCVar7);
    if (CVar2 < CVar1) {
      unaff_EBP = 1;
    }
    if (CVar1 < CVar2) {
      unaff_EBP = -1;
    }
    if (CVar1 != CVar2) break;
    pCVar6 = pCVar6 + 1;
    pCVar7 = pCVar7 + 1;
  }
  return unaff_EBP;
}

Assistant:

int
	cmpIgnoreCase_pcu(const StringRef& string) const {
		size_t length = AXL_MIN(m_length, string.m_length);

		const C* p1 = m_p;
		const C* p2 = string.m_p;
		const C* end = p1 + length;
		for (; p1 < end; p1++, p2++) {
			C c1 = Details::toLower(*p1);
			C c2 = Details::toLower(*p2);

			if (c1 < c2)
				return -1;
			else if (c1 > c2)
				return 1;
		}

		return
			m_length < string.m_length ? -1 :
			m_length > string.m_length ? 1 : 0;
	}